

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Chapters::Edition::ExpandAtomsArray(Edition *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  int iVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  Atom *pAVar10;
  ulong uVar11;
  Atom *pAVar12;
  bool bVar13;
  
  iVar3 = this->m_atoms_size;
  bVar13 = true;
  if (iVar3 <= this->m_atoms_count) {
    iVar6 = 1;
    if (iVar3 != 0) {
      iVar6 = iVar3 * 2;
    }
    uVar11 = (ulong)iVar6;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar11;
    uVar9 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
      uVar9 = SUB168(auVar4 * ZEXT816(0x30),0) | 8;
    }
    puVar7 = (ulong *)operator_new__(uVar9,(nothrow_t *)&std::nothrow);
    if (puVar7 == (ulong *)0x0) {
      pAVar10 = (Atom *)0x0;
    }
    else {
      *puVar7 = uVar11;
      pAVar10 = (Atom *)(puVar7 + 1);
      lVar8 = 0;
      pAVar12 = pAVar10;
      do {
        Atom::Atom(pAVar12);
        lVar8 = lVar8 + -0x30;
        pAVar12 = pAVar12 + 1;
      } while (-lVar8 != uVar11 * 0x30);
    }
    bVar13 = pAVar10 != (Atom *)0x0;
    if (bVar13) {
      iVar3 = this->m_atoms_count;
      if (0 < (long)iVar3) {
        pAVar12 = this->m_atoms;
        lVar8 = 0;
        do {
          *(undefined8 *)((long)&pAVar10->m_string_uid + lVar8) =
               *(undefined8 *)((long)&pAVar12->m_string_uid + lVar8);
          puVar1 = (undefined8 *)((long)&pAVar12->m_uid + lVar8);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pAVar10->m_uid + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          *(undefined8 *)((long)&pAVar10->m_stop_timecode + lVar8) =
               *(undefined8 *)((long)&pAVar12->m_stop_timecode + lVar8);
          *(undefined8 *)((long)&pAVar10->m_displays + lVar8) =
               *(undefined8 *)((long)&pAVar12->m_displays + lVar8);
          *(undefined8 *)((long)&pAVar10->m_displays_size + lVar8) =
               *(undefined8 *)((long)&pAVar12->m_displays_size + lVar8);
          lVar8 = lVar8 + 0x30;
        } while ((long)iVar3 * 0x30 != lVar8);
      }
      pAVar12 = this->m_atoms;
      if (pAVar12 != (Atom *)0x0) {
        if (*(long *)&pAVar12[-1].m_displays_size != 0) {
          lVar8 = *(long *)&pAVar12[-1].m_displays_size * 0x30;
          do {
            Atom::~Atom((Atom *)((long)&pAVar12[-1].m_string_uid + lVar8));
            lVar8 = lVar8 + -0x30;
          } while (lVar8 != 0);
        }
        operator_delete__(&pAVar12[-1].m_displays_size);
      }
      this->m_atoms = pAVar10;
      this->m_atoms_size = iVar6;
    }
  }
  return bVar13;
}

Assistant:

bool Chapters::Edition::ExpandAtomsArray() {
  if (m_atoms_size > m_atoms_count)
    return true;  // nothing else to do

  const int size = (m_atoms_size == 0) ? 1 : 2 * m_atoms_size;

  Atom* const atoms = new (std::nothrow) Atom[size];

  if (atoms == NULL)
    return false;

  for (int idx = 0; idx < m_atoms_count; ++idx) {
    m_atoms[idx].ShallowCopy(atoms[idx]);
  }

  delete[] m_atoms;
  m_atoms = atoms;

  m_atoms_size = size;
  return true;
}